

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceMatrix4x4.cpp
# Opt level: O0

float __thiscall IceMaths::Matrix4x4::CoFactor(Matrix4x4 *this,udword row,udword col)

{
  float local_1c;
  udword col_local;
  udword row_local;
  Matrix4x4 *this_local;
  
  local_1c = -1.0;
  if ((row + col & 1) == 0) {
    local_1c = 1.0;
  }
  return ((this->m[row + 1 & 3][col + 3 & 3] * this->m[row + 2 & 3][col + 1 & 3] *
           this->m[row + 3 & 3][col + 2 & 3] +
          this->m[row + 1 & 3][col + 1 & 3] * this->m[row + 2 & 3][col + 2 & 3] *
          this->m[row + 3 & 3][col + 3 & 3] +
          this->m[row + 1 & 3][col + 2 & 3] * this->m[row + 2 & 3][col + 3 & 3] *
          this->m[row + 3 & 3][col + 1 & 3]) -
         (this->m[row + 3 & 3][col + 3 & 3] * this->m[row + 2 & 3][col + 1 & 3] *
          this->m[row + 1 & 3][col + 2 & 3] +
         this->m[row + 3 & 3][col + 1 & 3] * this->m[row + 2 & 3][col + 2 & 3] *
         this->m[row + 1 & 3][col + 3 & 3] +
         this->m[row + 3 & 3][col + 2 & 3] * this->m[row + 2 & 3][col + 3 & 3] *
         this->m[row + 1 & 3][col + 1 & 3])) * local_1c;
}

Assistant:

float Matrix4x4::CoFactor(udword row, udword col) const
{
	return	 (( m[(row+1)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+3)&3][(col+3)&3] +
				m[(row+1)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+3)&3][(col+1)&3] +
				m[(row+1)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+3)&3][(col+2)&3])
			-  (m[(row+3)&3][(col+1)&3]*m[(row+2)&3][(col+2)&3]*m[(row+1)&3][(col+3)&3] +
				m[(row+3)&3][(col+2)&3]*m[(row+2)&3][(col+3)&3]*m[(row+1)&3][(col+1)&3] +
				m[(row+3)&3][(col+3)&3]*m[(row+2)&3][(col+1)&3]*m[(row+1)&3][(col+2)&3])) * ((row + col) & 1 ? -1.0f : +1.0f);
}